

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O0

void __thiscall cppcms::http::cookie::cookie(cookie *this,string *name,string *value,uint age)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  copy_ptr<cppcms::http::cookie::_data> *in_RDI;
  
  booster::copy_ptr<cppcms::http::cookie::_data>::copy_ptr(in_RDI);
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 5),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  std::__cxx11::string::string((string *)(in_RDI + 0x11));
  *(undefined4 *)&in_RDI[0x15].ptr_ = in_ECX;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffffe;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffffd | 2;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffffb;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffff7;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xffffffef;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xffffffdf;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xffffffbf;
  return;
}

Assistant:

cookie::cookie(std::string name,std::string value,unsigned age) :
	name_(name), value_(value), max_age_(age), secure_(0), has_age_(1), has_expiration_(0), httponly_(0), samesite_none_(0), samesite_lax_(0), samesite_strict_(0)
{
}